

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageOneofFieldGenerator::GenerateMembers
          (ImmutableLazyMessageOneofFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ImmutableLazyMessageOneofFieldGenerator *this_local;
  
  PrintExtraFieldInfo(&(this->super_ImmutableLazyMessageFieldGenerator).
                       super_ImmutableMessageFieldGenerator.variables_,printer);
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldGenerator).
                     super_ImmutableMessageFieldGenerator.descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutableLazyMessageFieldGenerator).
                              super_ImmutableMessageFieldGenerator.variables_,
                     "$deprecation$public boolean has$capitalized_name$() {\n  return $has_oneof_case_message$;\n}\n"
                    );
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldGenerator).
                     super_ImmutableMessageFieldGenerator.descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutableLazyMessageFieldGenerator).
                              super_ImmutableMessageFieldGenerator.variables_,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    return ($type$) (($lazy_type$) $oneof_name$_).getValue(\n        $type$.getDefaultInstance());\n  }\n  return $type$.getDefaultInstance();\n}\n"
                    );
  return;
}

Assistant:

void ImmutableLazyMessageOneofFieldGenerator::
GenerateMembers(io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_);

  printer->Print(variables_,
    "$deprecation$public boolean has$capitalized_name$() {\n"
    "  return $has_oneof_case_message$;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);

  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    return ($type$) (($lazy_type$) $oneof_name$_).getValue(\n"
    "        $type$.getDefaultInstance());\n"
    "  }\n"
    "  return $type$.getDefaultInstance();\n"
    "}\n");
}